

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::WildcardPortConnectionSyntax::setChild
          (WildcardPortConnectionSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 2) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->star).kind = TVar4.kind;
    (this->star).field_0x2 = TVar4._2_1_;
    (this->star).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->star).rawLen = TVar4.rawLen;
    (this->star).info = TVar4.info;
  }
  else if (index == 1) {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->dot).kind = TVar4.kind;
    (this->dot).field_0x2 = TVar4._2_1_;
    (this->dot).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->dot).rawLen = TVar4.rawLen;
    (this->dot).info = TVar4.info;
  }
  else {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         pSVar3->kind;
    *(undefined4 *)
     &(this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4
         = uVar2;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         pSVar1;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode
         = pSVar3->previewNode;
    (this->super_PortConnectionSyntax).attributes.super_SyntaxListBase.childCount =
         *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->super_PortConnectionSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  return;
}

Assistant:

void WildcardPortConnectionSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: dot = child.token(); return;
        case 2: star = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}